

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

int __thiscall cg_other::operator()(cg_other *this,point p)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_24;
  uint i;
  cg_other *this_local;
  point p_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::size(&this->data);
    if (sVar2 <= local_24) {
      return -1;
    }
    pvVar3 = std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::operator[]
                       (&this->data,(ulong)local_24);
    bVar1 = operator==(pvVar3->p,p);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  pvVar3 = std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::operator[]
                     (&this->data,(ulong)local_24);
  return pvVar3->ch;
}

Assistant:

int cg_other::operator()(point p) {
    for (unsigned i = 0; i < data.size(); i++) {
        if (data[i].p == p) return data[i].ch;
    }
    return -1;
}